

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O2

int re2::PCRE::GlobalReplace(string *str,PCRE *pattern,StringPiece *rewrite)

{
  uint veclen;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  undefined8 extraout_RDX_02;
  bool bVar2;
  PCRE *text;
  PCRE *this;
  int *in_R9;
  int iVar3;
  ulong uVar4;
  int local_144;
  StringPiece local_138;
  string out;
  int vec [51];
  
  bVar2 = false;
  text = (PCRE *)0x0;
  memset(vec,0,0xcc);
  out._M_dataplus._M_p = (pointer)&out.field_2;
  out._M_string_length = 0;
  out.field_2._M_local_buf[0] = '\0';
  local_144 = 0;
  uVar1 = extraout_RDX;
  do {
    uVar4 = 0;
LAB_0012dc58:
    iVar3 = (int)uVar4;
    if ((int)str->_M_string_length < iVar3) {
LAB_0012dd08:
      if (local_144 != 0) {
        if (iVar3 < (int)str->_M_string_length) {
          std::__cxx11::string::append((string *)&out,(ulong)str,uVar4);
        }
        std::__cxx11::string::swap((string *)&out);
      }
      std::__cxx11::string::~string((string *)&out);
      return local_144;
    }
    if (bVar2) {
      veclen = TryMatch(pattern,(StringPiece *)text,(int)uVar1,ANCHOR_START,false,in_R9,0x33);
      if (0 < (int)veclen) goto LAB_0012dcba;
      uVar1 = extraout_RDX_00;
      if (iVar3 < (int)str->_M_string_length) {
        text = (PCRE *)(ulong)(uint)(int)(str->_M_dataplus)._M_p[uVar4];
        std::__cxx11::string::push_back((char)(PCRE *)&out);
        uVar1 = extraout_RDX_01;
      }
      uVar4 = uVar4 + 1;
      bVar2 = false;
      goto LAB_0012dc58;
    }
    veclen = TryMatch(pattern,(StringPiece *)text,(int)uVar1,UNANCHORED,false,in_R9,0x33);
    if ((int)veclen < 1) goto LAB_0012dd08;
LAB_0012dcba:
    if (iVar3 != 0) {
      __assert_fail("matchstart >= start",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc",
                    0x1a3,
                    "static int re2::PCRE::GlobalReplace(string *, const PCRE &, const StringPiece &)"
                   );
    }
    this = (PCRE *)&out;
    std::__cxx11::string::append((string *)&out,(ulong)str,uVar4);
    local_138.ptr_ = (str->_M_dataplus)._M_p;
    local_138.length_ = (int)str->_M_string_length;
    in_R9 = (int *)(ulong)veclen;
    text = (PCRE *)&out;
    Rewrite(this,&out,rewrite,&local_138,vec,veclen);
    local_144 = local_144 + 1;
    bVar2 = true;
    uVar1 = extraout_RDX_02;
  } while( true );
}

Assistant:

int PCRE::GlobalReplace(string *str,
                      const PCRE& pattern,
                      const StringPiece& rewrite) {
  int count = 0;
  int vec[kVecSize] = {};
  string out;
  int start = 0;
  bool last_match_was_empty_string = false;

  while (start <= static_cast<int>(str->size())) {
    // If the previous match was for the empty string, we shouldn't
    // just match again: we'll match in the same way and get an
    // infinite loop.  Instead, we do the match in a special way:
    // anchored -- to force another try at the same position --
    // and with a flag saying that this time, ignore empty matches.
    // If this special match returns, that means there's a non-empty
    // match at this position as well, and we can continue.  If not,
    // we do what perl does, and just advance by one.
    // Notice that perl prints '@@@' for this;
    //    perl -le '$_ = "aa"; s/b*|aa/@/g; print'
    int matches;
    if (last_match_was_empty_string) {
      matches = pattern.TryMatch(*str, start, ANCHOR_START, false,
                                 vec, kVecSize);
      if (matches <= 0) {
        if (start < static_cast<int>(str->size()))
          out.push_back((*str)[start]);
        start++;
        last_match_was_empty_string = false;
        continue;
      }
    } else {
      matches = pattern.TryMatch(*str, start, UNANCHORED, true,
                                 vec, kVecSize);
      if (matches <= 0)
        break;
    }
    int matchstart = vec[0], matchend = vec[1];
    assert(matchstart >= start);
    assert(matchend >= matchstart);

    out.append(*str, start, matchstart - start);
    pattern.Rewrite(&out, rewrite, *str, vec, matches);
    start = matchend;
    count++;
    last_match_was_empty_string = (matchstart == matchend);
  }

  if (count == 0)
    return 0;

  if (start < static_cast<int>(str->size()))
    out.append(*str, start, static_cast<int>(str->size()) - start);
  swap(out, *str);
  return count;
}